

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O2

void __thiscall
flatbuffers::dart::DartGenerator::TableBuilderBody
          (DartGenerator *this,StructDef *struct_def,
          vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
          *non_deprecated_fields,string *code)

{
  int t;
  BaseType BVar1;
  FieldDef *def;
  Namespace *current_namespace;
  IdlNamer *pIVar2;
  pointer ppVar3;
  string add_field;
  string field_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
  *local_150;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  StructDef *local_e8;
  IdlNamer *local_e0;
  pointer local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_150 = non_deprecated_fields;
  std::__cxx11::string::append((char *)code);
  local_e8 = struct_def;
  NumToString<unsigned_long>
            (&local_148,
             (long)(struct_def->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(struct_def->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  std::operator+(&local_108,"    fbBuilder.startTable(",&local_148);
  std::operator+(&local_128,&local_108,");\n");
  std::__cxx11::string::append((string *)code);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::append((char *)code);
  ppVar3 = (local_150->
           super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_e0 = &this->namer_;
  while( true ) {
    if (ppVar3 == (local_150->
                  super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) break;
    def = ppVar3->second;
    t = ppVar3->first;
    local_d8 = ppVar3;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"add",(allocator<char> *)&local_148);
    pIVar2 = local_e0;
    (*(local_e0->super_Namer)._vptr_Namer[3])(&local_128,local_e0,&local_108,def);
    std::__cxx11::string::~string((string *)&local_108);
    (*(pIVar2->super_Namer)._vptr_Namer[7])(&local_108,pIVar2,def);
    BVar1 = (def->value).type.base_type;
    if (BVar1 - BASE_TYPE_UTYPE < 0xc) {
      std::operator+(&local_170,"  int ",&local_128);
      std::operator+(&local_148,&local_170,"(");
      std::__cxx11::string::append((string *)code);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_170);
      current_namespace = (local_e8->super_Definition).defined_namespace;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"",(allocator<char> *)&local_170);
      GenDartTypeName(&local_148,this,&(def->value).type,current_namespace,def,&local_50);
      std::__cxx11::string::append((string *)code);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_50);
      std::operator+(&local_170,"? ",&local_108);
      std::operator+(&local_148,&local_170,") {\n");
      std::__cxx11::string::append((string *)code);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_170);
      GenType_abi_cxx11_(&local_90,this,&(def->value).type);
      std::operator+(&local_70,"    fbBuilder.add",&local_90);
      std::operator+(&local_d0,&local_70,"(");
      NumToString<int>(&local_b0,t);
      std::operator+(&local_170,&local_d0,&local_b0);
      std::operator+(&local_148,&local_170,", ");
      std::__cxx11::string::append((string *)code);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::append((string *)code);
      if ((def->value).type.enum_def != (EnumDef *)0x0) {
        std::__cxx11::string::append((char *)code);
      }
      std::__cxx11::string::append((char *)code);
    }
    else {
      if ((BVar1 == BASE_TYPE_STRUCT) && (((def->value).type.struct_def)->fixed == true)) {
        std::operator+(&local_170,"  int ",&local_128);
        std::operator+(&local_148,&local_170,"(int offset) {\n");
        std::__cxx11::string::append((string *)code);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_170);
        NumToString<int>(&local_d0,t);
        std::operator+(&local_170,"    fbBuilder.addStruct(",&local_d0);
        std::operator+(&local_148,&local_170,", offset);\n");
        std::__cxx11::string::append((string *)code);
      }
      else {
        std::operator+(&local_170,"  int ",&local_128);
        std::operator+(&local_148,&local_170,"Offset(int? offset) {\n");
        std::__cxx11::string::append((string *)code);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_170);
        NumToString<int>(&local_d0,t);
        std::operator+(&local_170,"    fbBuilder.addOffset(",&local_d0);
        std::operator+(&local_148,&local_170,", offset);\n");
        std::__cxx11::string::append((string *)code);
      }
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    std::__cxx11::string::append((char *)code);
    std::__cxx11::string::append((char *)code);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    ppVar3 = local_d8 + 1;
  }
  std::__cxx11::string::append((char *)code);
  std::__cxx11::string::append((char *)code);
  std::__cxx11::string::append((char *)code);
  std::__cxx11::string::append((char *)code);
  return;
}

Assistant:

void TableBuilderBody(
      const StructDef &struct_def,
      const std::vector<std::pair<int, FieldDef *>> &non_deprecated_fields,
      std::string &code) {
    code += "  void begin() {\n";
    code += "    fbBuilder.startTable(" +
            NumToString(struct_def.fields.vec.size()) + ");\n";
    code += "  }\n\n";

    for (auto it = non_deprecated_fields.begin();
         it != non_deprecated_fields.end(); ++it) {
      const auto &field = *it->second;
      const auto offset = it->first;
      const std::string add_field = namer_.Method("add", field);
      const std::string field_var = namer_.Variable(field);

      if (IsScalar(field.value.type.base_type)) {
        code += "  int " + add_field + "(";
        code += GenDartTypeName(field.value.type, struct_def.defined_namespace,
                                field);
        code += "? " + field_var + ") {\n";
        code += "    fbBuilder.add" + GenType(field.value.type) + "(" +
                NumToString(offset) + ", ";
        code += field_var;
        if (field.value.type.enum_def) { code += "?.value"; }
        code += ");\n";
      } else if (IsStruct(field.value.type)) {
        code += "  int " + add_field + "(int offset) {\n";
        code +=
            "    fbBuilder.addStruct(" + NumToString(offset) + ", offset);\n";
      } else {
        code += "  int " + add_field + "Offset(int? offset) {\n";
        code +=
            "    fbBuilder.addOffset(" + NumToString(offset) + ", offset);\n";
      }
      code += "    return fbBuilder.offset;\n";
      code += "  }\n";
    }

    code += "\n";
    code += "  int finish() {\n";
    code += "    return fbBuilder.endTable();\n";
    code += "  }\n";
  }